

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_shader_program_from_files.h
# Opt level: O1

bool create_shader_program_from_files
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vertex_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *tess_control_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *tess_evaluation_shader_paths,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fragment_shader_paths,GLuint *id)

{
  GLuint GVar1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  bool bVar5;
  anon_class_1_0_00000001 create_compile_attach;
  GLuint f;
  GLuint te;
  GLuint tc;
  GLuint v;
  GLint status;
  anon_class_1_0_00000001 local_45;
  GLuint local_44 [5];
  
  GVar1 = (*glad_glCreateProgram)();
  *id = GVar1;
  if (GVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m\x1b[31m",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[m",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": could not create shader program.",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    bVar5 = false;
  }
  else {
    local_44[3] = 0;
    local_44[2] = 0;
    local_44[1] = 0;
    local_44[0] = 0;
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              (&local_45,vertex_shader_paths,0x8b31,GVar1,local_44 + 3);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              (&local_45,tess_control_shader_paths,0x8e88,*id,local_44 + 2);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              (&local_45,tess_evaluation_shader_paths,0x8e87,*id,local_44 + 1);
    create_shader_program_from_files::anon_class_1_0_00000001::operator()
              (&local_45,fragment_shader_paths,0x8b30,*id,local_44);
    (*glad_glLinkProgram)(*id);
    GVar1 = local_44[0];
    if (local_44[0] != 0) {
      (*glad_glDetachShader)(*id,local_44[0]);
      (*glad_glDeleteShader)(GVar1);
    }
    GVar1 = local_44[3];
    if (local_44[3] != 0) {
      (*glad_glDetachShader)(*id,local_44[3]);
      (*glad_glDeleteShader)(GVar1);
    }
    print_program_info_log(*id);
    (*glad_glGetProgramiv)(*id,0x8b82,(GLint *)(local_44 + 4));
    bVar5 = local_44[4] == 1;
    if (bVar5) {
      plVar4 = &std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1m\x1b[32m",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"shader compilation successful.",0x1e);
      pcVar3 = "\x1b[m";
      lVar2 = 3;
    }
    else {
      plVar4 = &std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m\x1b[31m",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[m",3);
      pcVar3 = ": Failed to link shader program";
      lVar2 = 0x1f;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar4,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  return bVar5;
}

Assistant:

inline bool create_shader_program_from_files(
  const std::vector<std::string> & vertex_shader_paths,
  const std::vector<std::string> & tess_control_shader_paths,
  const std::vector<std::string> & tess_evaluation_shader_paths,
  const std::vector<std::string> & fragment_shader_paths,
  GLuint & id)
{
  const auto create_compile_attach = [](
    const std::vector<std::string> & paths, 
    const GLenum type, 
    const GLuint prog_id, 
    GLuint & s) -> bool
  {
    const std::string type_str = 
      (type == GL_VERTEX_SHADER ?                STR(BOLD("vertex shader")) :
        (type == GL_FRAGMENT_SHADER ?            STR(BOLD("fragment shader")) :
          (type == GL_TESS_CONTROL_SHADER ?      STR(BOLD("tessellation control shader")) :
            (type == GL_TESS_EVALUATION_SHADER ? STR(BOLD("tessellation evaluation shader")) : 
               "unknown shader"))));
    int total_length = 0;
    std::vector<std::string> strs;
    {
      for(int p = 0;p<paths.size();p++)
      {
        const auto & path = paths[p];
        std::ifstream t(path);
        if(t.fail())
        {
          std::cerr<<REDRUM("ERROR")<<": failed to open "<<path<<std::endl;
          return false;
        }
        std::stringstream buffer;
        buffer << t.rdbuf();
        if(p!=0)
        {
          strs.push_back(STR(std::endl<<"#line 1 "<<p<<std::endl));
        }
        strs.push_back(buffer.str());
        total_length += buffer.str().length();
      }
    }
    std::vector<const char *> cstrs;
    for(const auto & str : strs)
    {
      cstrs.emplace_back(str.c_str());
    }
    if(total_length == 0)
    {
      std::cerr<<YELLOWRUM("WARNING")<<": "<<type_str<<" is empty..."<<std::endl;;
      s = 0;
      return false;
    }
    s = glCreateShader(type);
    if(s == 0)
    {
      std::cerr<<"failed to create "<<type_str<<std::endl;
      return false;
    }
    {
      glShaderSource(s,cstrs.size(),&cstrs[0],NULL);
    }
    glCompileShader(s);
    print_shader_info_log(type_str,s,paths);
    if(!glIsShader(s))
    {
      std::cerr<<type_str<<" failed to compile."<<std::endl;
      return false;
    }
    glAttachShader(prog_id,s);
    return true;
  };

  // create program
  id = glCreateProgram();
  if(id == 0)
  {
    std::cerr<<REDRUM("ERROR")<<": could not create shader program."<<std::endl;
    return false;
  }

  // create shaders
  GLuint v=0,tc=0,te=0,f=0;

  create_compile_attach(vertex_shader_paths,GL_VERTEX_SHADER,id,v);
  create_compile_attach(tess_control_shader_paths,GL_TESS_CONTROL_SHADER,id,tc);
  create_compile_attach(tess_evaluation_shader_paths,GL_TESS_EVALUATION_SHADER,id,te);
  create_compile_attach(fragment_shader_paths,GL_FRAGMENT_SHADER,id,f);

  // Link program
  glLinkProgram(id);
  const auto & detach = [&id](const GLuint shader)
  {
    if(shader)
    {
      glDetachShader(id,shader);
      glDeleteShader(shader);
    }
  };
  detach(f);
  detach(v);

  // print log if any
  print_program_info_log(id);
  GLint status;
  glGetProgramiv(id,GL_LINK_STATUS,&status);
  if(status != GL_TRUE)
  {
    std::cerr<<REDRUM("ERROR")<<": Failed to link shader program"<<std::endl;
    return false;
  }

  std::cout<<GREENRUM("shader compilation successful.")<<std::endl;
  return true;
}